

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O1

Name wasm::Names::getValidDataSegmentName(Module *module,Name root)

{
  long lVar1;
  long lVar2;
  string *in_R9;
  Name root_00;
  IString IVar3;
  long *local_78 [2];
  long local_68 [2];
  Module *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  uStack_50 = 0;
  pcStack_40 = std::
               _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:109:5)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:109:5)>
             ::_M_manager;
  lVar1 = *(long *)(module + 0x90);
  lVar2 = *(long *)(module + 0x98);
  local_78[0] = local_68;
  local_58 = module;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"_","");
  root_00.super_IString.str._M_str = (char *)&local_58;
  root_00.super_IString.str._M_len = (size_t)root.super_IString.str._M_str;
  IVar3.str = (string_view)
              getValidName(root.super_IString.str._M_len,root_00,
                           (function<bool_(wasm::Name)> *)((ulong)(lVar2 - lVar1) >> 3 & 0xffffffff)
                           ,(Index)local_78,in_R9);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return (IString)(IString)IVar3.str;
}

Assistant:

inline Name getValidDataSegmentName(Module& module, Name root) {
  return getValidName(
    root,
    [&](Name test) { return !module.getDataSegmentOrNull(test); },
    module.dataSegments.size());
}